

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsmanal.cpp
# Opt level: O0

void __thiscall
TPZSubMeshAnalysis::CondensedSolution
          (TPZSubMeshAnalysis *this,TPZFMatrix<double> *ek,TPZFMatrix<double> *ef)

{
  bool bVar1;
  TPZMatrix<double> *pTVar2;
  TPZFMatrix<double> *in_RSI;
  TPZFMatrix<double> *in_RDI;
  TPZMatRed<double,_TPZFMatrix<double>_> *unaff_retaddr;
  TPZMatRed<double,_TPZFMatrix<double>_> *matred;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  TPZFMatrix<double> *K11;
  
  K11 = in_RDI;
  bVar1 = ::TPZAutoPointer::operator_cast_to_bool
                    ((TPZAutoPointer *)&in_RDI[9].super_TPZMatrix<double>.super_TPZBaseMatrix.fRow);
  if (!bVar1) {
    pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  }
  pTVar2 = TPZAutoPointer<TPZMatrix<double>_>::operator->
                     ((TPZAutoPointer<TPZMatrix<double>_> *)
                      &in_RDI[9].super_TPZMatrix<double>.super_TPZBaseMatrix.fRow);
  if (pTVar2 != (TPZMatrix<double> *)0x0) {
    __dynamic_cast(pTVar2,&TPZMatrix<double>::typeinfo,
                   &TPZMatRed<double,TPZFMatrix<double>>::typeinfo,0);
  }
  TPZMatRed<double,_TPZFMatrix<double>_>::K11Reduced(unaff_retaddr,K11,in_RSI);
  return;
}

Assistant:

void TPZSubMeshAnalysis::CondensedSolution(TPZFMatrix<STATE> &ek, TPZFMatrix<STATE> &ef){
//	time_t tempo = time(NULL);
	if (!fReducableStiff) {
        DebugStop();
    }
	TPZMatRed<STATE, TPZFMatrix<STATE> > *matred = dynamic_cast<TPZMatRed<STATE, TPZFMatrix<STATE> > *> (fReducableStiff.operator->());
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        matred->Print("Before = ",sout,EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    matred->K11Reduced(ek, ef);
	
//	time_t tempodepois = time(NULL);
//	double elapsedtime = difftime(tempodepois, tempo);
	
//	std::cout << "Tempo para inversao " << elapsedtime << std::endl;
	
}